

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::MergeFromImpl<true>
          (internal *this,StringPiece input,MessageLite *msg,ParseFlags parse_flags)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  MessageLite *this_00;
  StringPiece flat;
  undefined1 local_90 [8];
  ParseContext ctx;
  
  this_00 = (MessageLite *)input.length_;
  ctx.super_EpsCopyInputStream.buffer_[0x10] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x11] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x12] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x13] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x14] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x15] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x16] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x17] = '\0';
  ctx.super_EpsCopyInputStream.size_ = 0;
  ctx.super_EpsCopyInputStream.limit_ = 0;
  ctx.super_EpsCopyInputStream.zcis_ = (ZeroCopyInputStream *)0x0;
  ctx.super_EpsCopyInputStream.buffer_[0] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[1] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[2] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[3] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[4] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[5] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[6] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[7] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[8] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[9] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[10] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xb] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xc] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xd] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xe] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0xf] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x18] = '\x01';
  ctx.super_EpsCopyInputStream.buffer_[0x19] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x1a] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x1b] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x1c] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x1d] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x1e] = '\0';
  ctx.super_EpsCopyInputStream.buffer_[0x1f] = '\0';
  ctx.super_EpsCopyInputStream.aliasing_ = 0x7fffffff00000000;
  ctx.super_EpsCopyInputStream.last_tag_minus_1_ = io::CodedInputStream::default_recursion_limit_;
  ctx.super_EpsCopyInputStream.overall_limit_ = -0x80000000;
  ctx.depth_ = 0;
  ctx.group_depth_ = 0;
  ctx.data_.pool = (DescriptorPool *)0x0;
  flat.length_ = (stringpiece_ssize_type)input.ptr_;
  flat.ptr_ = (char *)this;
  pcVar3 = EpsCopyInputStream::InitFrom((EpsCopyInputStream *)local_90,flat);
  iVar2 = (*this_00->_vptr_MessageLite[0xb])(this_00,pcVar3,(EpsCopyInputStream *)local_90);
  cVar1 = '\0';
  if ((CONCAT44(extraout_var,iVar2) != 0) && ((int)ctx.super_EpsCopyInputStream.aliasing_ == 0)) {
    if (((ulong)msg & 2) == 0) {
      iVar2 = (*this_00->_vptr_MessageLite[6])(this_00);
      cVar1 = (char)iVar2;
      if (cVar1 == '\0') {
        MessageLite::LogInitializationErrorMessage(this_00);
      }
    }
    else {
      cVar1 = '\x01';
    }
  }
  return (bool)cVar1;
}

Assistant:

bool MergeFromImpl(StringPiece input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has an explicit limit set (length of string_view).
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}